

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeGapGrayCode.cpp
# Opt level: O0

void __thiscall
LargeGapGrayCode::createCodeFromTheorem1(LargeGapGrayCode *this,int n,int m,int s,int t)

{
  bool bVar1;
  reference this_00;
  reference this_01;
  ostream *poVar2;
  __type _Var3;
  string local_220 [32];
  stringstream local_200 [8];
  stringstream ss;
  ostream local_1f0 [376];
  undefined1 local_78 [8];
  vector<int,_std::allocator<int>_> t_1;
  undefined1 local_50 [8];
  vector<char,_std::allocator<char>_> Z;
  vector<char,_std::allocator<char>_> P;
  int t_local;
  int s_local;
  int m_local;
  int n_local;
  LargeGapGrayCode *this_local;
  
  if ((((m <= n) && (0 < m)) && (bVar1 = isOddPositive(this,s), bVar1)) &&
     (bVar1 = isOddPositive(this,t), bVar1)) {
    _Var3 = std::pow<int,int>(2,m);
    if ((((double)(s + t) == _Var3) && (!NAN((double)(s + t)) && !NAN(_Var3))) && (n + m < 0x15)) {
      createPVector((vector<char,_std::allocator<char>_> *)
                    &Z.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,this,s,t);
      _Var3 = std::pow<int,int>(2,n);
      multiCopyVector((vector<char,_std::allocator<char>_> *)local_50,this,
                      (vector<char,_std::allocator<char>_> *)
                      &Z.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,
                      (int)_Var3);
      createTransitionSequenceTheorem1
                ((vector<int,_std::allocator<int>_> *)local_78,this,n,m,
                 (vector<char,_std::allocator<char>_> *)local_50);
      this_00 = std::
                vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ::operator[](&this->m_transitionSequences,(long)(n + -1 + m));
      std::vector<int,_std::allocator<int>_>::operator=
                (this_00,(vector<int,_std::allocator<int>_> *)local_78);
      std::__cxx11::stringstream::stringstream(local_200);
      poVar2 = std::operator<<(local_1f0,"(");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,n);
      poVar2 = std::operator<<(poVar2," + ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,m);
      std::operator<<(poVar2,")");
      std::__cxx11::stringstream::str();
      this_01 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[](&this->m_creationMethod,(long)(n + m + -1));
      std::__cxx11::string::operator=((string *)this_01,local_220);
      std::__cxx11::string::~string(local_220);
      std::__cxx11::stringstream::~stringstream(local_200);
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_78)
      ;
      std::vector<char,_std::allocator<char>_>::~vector
                ((vector<char,_std::allocator<char>_> *)local_50);
      std::vector<char,_std::allocator<char>_>::~vector
                ((vector<char,_std::allocator<char>_> *)
                 &Z.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
      return;
    }
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"Constraints for Theorem 1 are not satisfied.");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void LargeGapGrayCode::createCodeFromTheorem1(int n, int m, int s, int t)
{
	if(n >= m && m >= 1 && isOddPositive(s) && isOddPositive(t) && (s+t) == pow(2,m) && (n+m <= maxBitWidth)) {
		std::vector<char> P = createPVector(s, t);
		std::vector<char> Z = multiCopyVector(P, pow(2, n));
		std::vector<int> t = createTransitionSequenceTheorem1(n, m, Z);
		m_transitionSequences[n+m-1] = t;
		std::stringstream ss;
		ss << "(" << n << " + " << m << ")";
		m_creationMethod[n+m-1] = ss.str();
	}
	else {
		std::cout << "Constraints for Theorem 1 are not satisfied." << std::endl;
	}
}